

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

char * MIR_alias_name(MIR_context_t ctx,MIR_alias_t alias)

{
  VARR_string_t *pVVar1;
  long lVar2;
  
  if (alias == 0) {
    return "";
  }
  pVVar1 = ctx->alias_ctx->aliases;
  if (pVVar1 == (VARR_string_t *)0x0) {
    MIR_alias_name_cold_1();
  }
  else if ((ulong)alias < pVVar1->els_num) {
    return pVVar1->varr[alias].str.s;
  }
  lVar2 = 3;
  (*ctx->error_func)(MIR_alloc_error,"Wrong alias number");
  return *(char **)(lVar2 + 0x10);
}

Assistant:

const char *MIR_alias_name (MIR_context_t ctx, MIR_alias_t alias) {
  if (alias == 0) return "";
  if (alias >= VARR_LENGTH (string_t, aliases))
    MIR_get_error_func (ctx) (MIR_alloc_error, "Wrong alias number");
  return VARR_ADDR (string_t, aliases)[alias].str.s;
}